

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# capi.c
# Opt level: O3

void NGA_List_nodeid(int *nlist,int nprocs)

{
  Integer *list;
  long lVar1;
  long num_procs;
  
  num_procs = (long)nprocs;
  list = (Integer *)malloc(num_procs * 4);
  pnga_list_nodeid(list,num_procs);
  if (0 < nprocs) {
    lVar1 = 0;
    do {
      nlist[lVar1] = (int)list[lVar1];
      lVar1 = lVar1 + 1;
    } while (num_procs != lVar1);
  }
  free(list);
  return;
}

Assistant:

void NGA_List_nodeid(int *nlist, int nprocs)
{
  Integer i, procs;
  Integer *list;
  procs = (Integer)(nprocs);
  list = malloc(procs*sizeof(int));
  wnga_list_nodeid(list, procs);
  for (i=0; i<procs; i++) {
    nlist[i] = (int)list[i];
  }
  free(list);
}